

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O3

RationalNum * __thiscall RationalNum::operator++(RationalNum *this)

{
  RationalNum RVar1;
  RationalNum local_20;
  
  local_20.numerator = 1;
  local_20.denominator = 1;
  simplify(&local_20);
  RVar1 = ::operator+(this,&local_20);
  this->numerator = (long)(int)RVar1.numerator;
  setDenominator(this,(long)(int)RVar1.denominator);
  return this;
}

Assistant:

RationalNum &RationalNum::operator++() {
    *this = *this + 1ll;
    return *this;
}